

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool NiceBody(TidyDocImpl *doc)

{
  Node *node_00;
  AttVal *pAVar1;
  Node *node;
  TidyDocImpl *doc_local;
  
  node_00 = prvTidyFindBody(doc);
  if ((node_00 == (Node *)0x0) ||
     ((((pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_BACKGROUND), pAVar1 == (AttVal *)0x0 &&
        (pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_BGCOLOR), pAVar1 == (AttVal *)0x0)) &&
       (pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_TEXT), pAVar1 == (AttVal *)0x0)) &&
      (((pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_LINK), pAVar1 == (AttVal *)0x0 &&
        (pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_VLINK), pAVar1 == (AttVal *)0x0)) &&
       (pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_ALINK), pAVar1 == (AttVal *)0x0)))))) {
    doc_local._4_4_ = yes;
  }
  else {
    doc->badLayout = doc->badLayout | 0x10;
    doc_local._4_4_ = no;
  }
  return doc_local._4_4_;
}

Assistant:

static Bool NiceBody( TidyDocImpl* doc )
{
    Node* node = TY_(FindBody)(doc);
    if (node)
    {
        if (TY_(AttrGetById)(node, TidyAttr_BACKGROUND) ||
            TY_(AttrGetById)(node, TidyAttr_BGCOLOR)    ||
            TY_(AttrGetById)(node, TidyAttr_TEXT)       ||
            TY_(AttrGetById)(node, TidyAttr_LINK)       ||
            TY_(AttrGetById)(node, TidyAttr_VLINK)      ||
            TY_(AttrGetById)(node, TidyAttr_ALINK))
        {
            doc->badLayout |= USING_BODY;
            return no;
        }
    }

    return yes;
}